

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

string * __thiscall
(anonymous_namespace)::InvalidInputSource::getName_abi_cxx11_(InvalidInputSource *this)

{
  int iVar1;
  
  if (getName[abi:cxx11]()::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getName[abi:cxx11]()::name_abi_cxx11_);
    if (iVar1 != 0) {
      getName[abi:cxx11]()::name_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getName[abi:cxx11]()::name_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&getName[abi:cxx11]()::name_abi_cxx11_,"closed input source","");
      __cxa_atexit(std::__cxx11::string::~string,&getName[abi:cxx11]()::name_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getName[abi:cxx11]()::name_abi_cxx11_);
    }
  }
  return &getName[abi:cxx11]()::name_abi_cxx11_;
}

Assistant:

std::string const&
        getName() const override
        {
            static std::string name("closed input source");
            return name;
        }